

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O2

void * vmd_pool_alloc(vmd_pool_t *pool,size_t s)

{
  vmd_pool_chunk_t *pvVar1;
  ulong uVar2;
  ulong uVar3;
  vmd_pool_chunk_t *pvVar4;
  
  pvVar4 = pool->chunk;
  if ((pvVar4 == (vmd_pool_chunk_t *)0x0) || (uVar3 = pvVar4->free, uVar3 < s)) {
    uVar2 = 0x200;
    if (0x200 < s) {
      uVar2 = s;
    }
    pvVar1 = (vmd_pool_chunk_t *)malloc(uVar2 + 0x18);
    pvVar1->size = uVar2;
    pvVar1->free = uVar2;
    pvVar1->next = pvVar4;
    pool->chunk = pvVar1;
    uVar3 = uVar2;
    pvVar4 = pvVar1;
  }
  else {
    uVar2 = pvVar4->size;
  }
  pvVar4->free = uVar3 - s;
  return (void *)((long)pvVar4 + (uVar2 - uVar3) + 0x18);
}

Assistant:

void *
pool_alloc(pool_t *pool, size_t s)
{
	if (pool->chunk == NULL || pool->chunk->free < s ) {
		pool_chunk_t *chunk = alloc_chunk(MAX(512, s));
		chunk->next = pool->chunk;
		pool->chunk = chunk;
	}

	void *ret = pool->chunk->data + pool->chunk->size - pool->chunk->free;
	pool->chunk->free -= s;
	return ret;
}